

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

void printModel(ModelPtr *model,bool includeMaths)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  ComponentPtr component;
  size_t c;
  string local_b0 [32];
  ulong local_90;
  size_t u;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_38 [39];
  byte local_11;
  __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Stack_10;
  bool includeMaths_local;
  ModelPtr *model_local;
  
  local_11 = includeMaths;
  p_Stack_10 = (__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               model;
  poVar3 = std::operator<<((ostream *)&std::cout,"MODEL: \'");
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            (p_Stack_10);
  libcellml::NamedEntity::name_abi_cxx11_();
  poVar3 = std::operator<<(poVar3,local_38);
  std::operator<<(poVar3,"\'");
  std::__cxx11::string::~string(local_38);
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            (p_Stack_10);
  libcellml::Entity::id_abi_cxx11_();
  bVar2 = std::operator!=(&local_68,"");
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cout,", id: \'");
    std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (p_Stack_10);
    libcellml::Entity::id_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,(string *)&u);
    std::operator<<(poVar3,"\'");
    std::__cxx11::string::~string((string *)&u);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&FIXED_INDENT_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"UNITS: ");
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            (p_Stack_10);
  uVar4 = libcellml::Model::unitsCount();
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
  poVar3 = std::operator<<(poVar3," custom units");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  local_90 = 0;
  while( true ) {
    uVar4 = local_90;
    std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (p_Stack_10);
    uVar5 = libcellml::Model::unitsCount();
    if (uVar5 <= uVar4) break;
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&FIXED_INDENT_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,(string *)&FIXED_INDENT_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"[");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_90 + 1);
    poVar3 = std::operator<<(poVar3,"]: ");
    std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (p_Stack_10);
    libcellml::Model::units((ulong)&c);
    std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)&c
              );
    libcellml::NamedEntity::name_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_b0);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_b0);
    std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)&c);
    local_90 = local_90 + 1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&FIXED_INDENT_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"COMPONENTS: ");
  std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            (p_Stack_10);
  uVar4 = libcellml::ComponentEntity::componentCount();
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,uVar4);
  poVar3 = std::operator<<(poVar3," components");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    _Var1._M_pi = component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (p_Stack_10);
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             libcellml::ComponentEntity::componentCount();
    if (p_Var6 <= _Var1._M_pi) break;
    std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (p_Stack_10);
    libcellml::ComponentEntity::component((ulong)local_d8);
    _Var1 = component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    std::operator+(&local_f8,&FIXED_INDENT_abi_cxx11_,&FIXED_INDENT_abi_cxx11_);
    printComponent((ComponentPtr *)local_d8,(size_t)_Var1._M_pi,&local_f8,(bool)(local_11 & 1));
    std::__cxx11::string::~string((string *)&local_f8);
    std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_d8)
    ;
    component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 1;
  }
  return;
}

Assistant:

void printModel(const libcellml::ModelPtr &model, bool includeMaths)
{
    std::cout << "MODEL: '" << model->name() << "'";
    if (model->id() != "") {
        std::cout << ", id: '" << model->id() << "'";
    }
    std::cout << std::endl;

    std::cout << FIXED_INDENT << "UNITS: " << model->unitsCount() << " custom units" << std::endl;
    for (size_t u = 0; u < model->unitsCount(); ++u) {
        std::cout << FIXED_INDENT << FIXED_INDENT << "[" << u + 1 << "]: " << model->units(u)->name() << std::endl;
    }

    std::cout << FIXED_INDENT << "COMPONENTS: " << model->componentCount() << " components" << std::endl;
    for (size_t c = 0; c < model->componentCount(); ++c) {
        auto component = model->component(c);
        printComponent(component, c, FIXED_INDENT + FIXED_INDENT, includeMaths);
    }
}